

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_whitelist_sign
              (secp256k1_context *ctx,secp256k1_whitelist_signature *sig,
              secp256k1_pubkey *online_pubkeys,secp256k1_pubkey *offline_pubkeys,size_t n_keys,
              secp256k1_pubkey *sub_pubkey,uchar *online_seckey,uchar *summed_seckey,size_t index,
              secp256k1_nonce_function noncefp,void *noncedata)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  byte bVar35;
  undefined1 auVar36 [16];
  uint64_t *puVar37;
  uint64_t *puVar38;
  uint64_t *puVar39;
  uint64_t *puVar40;
  size_t sVar41;
  int iVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  code *pcVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  secp256k1_scalar *r;
  secp256k1_context *ecmult_ctx;
  long lVar61;
  uchar *b32;
  bool bVar62;
  int overflow_1;
  secp256k1_context *local_a128;
  ulong local_a120;
  secp256k1_scalar sec;
  secp256k1_scalar non;
  uchar seckey32 [32];
  int overflow;
  uint uStack_a0a4;
  undefined8 uStack_a0a0;
  undefined8 local_a098;
  undefined8 uStack_a090;
  uchar msg32 [32];
  size_t n_keys_local;
  secp256k1_scalar s [256];
  secp256k1_gej pubs [256];
  
  sVar41 = index;
  pcVar49 = nonce_function_rfc6979;
  if (noncefp != (secp256k1_nonce_function)0x0) {
    pcVar49 = noncefp;
  }
  n_keys_local = n_keys;
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    secp256k1_whitelist_sign_cold_10();
  }
  else if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    secp256k1_whitelist_sign_cold_9();
  }
  else if (sig == (secp256k1_whitelist_signature *)0x0) {
    secp256k1_whitelist_sign_cold_8();
  }
  else if (online_pubkeys == (secp256k1_pubkey *)0x0) {
    secp256k1_whitelist_sign_cold_7();
  }
  else if (offline_pubkeys == (secp256k1_pubkey *)0x0) {
    secp256k1_whitelist_sign_cold_6();
  }
  else if (n_keys < 0x101) {
    if (sub_pubkey == (secp256k1_pubkey *)0x0) {
      secp256k1_whitelist_sign_cold_4();
    }
    else if (online_seckey == (uchar *)0x0) {
      secp256k1_whitelist_sign_cold_3();
    }
    else if (summed_seckey == (uchar *)0x0) {
      secp256k1_whitelist_sign_cold_2();
    }
    else {
      if (index < n_keys) {
        iVar42 = secp256k1_whitelist_compute_keys_and_message
                           (ctx,msg32,pubs,online_pubkeys,offline_pubkeys,(int)n_keys,sub_pubkey);
        if (iVar42 == 0) {
          return 0;
        }
        _overflow = (ulong)uStack_a0a4 << 0x20;
        secp256k1_scalar_set_b32(&sec,summed_seckey,&overflow);
        if ((overflow == 0) &&
           (((sec.d[1] != 0 || sec.d[0] != 0) || sec.d[2] != 0) || sec.d[3] != 0)) {
          secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,(secp256k1_gej *)s,&sec);
          iVar42 = secp256k1_whitelist_hash_pubkey(&non,(secp256k1_gej *)s);
          if (iVar42 != 0) {
            auVar2._8_8_ = 0;
            auVar2._0_8_ = sec.d[0];
            auVar18._8_8_ = 0;
            auVar18._0_8_ = non.d[0];
            uVar44 = SUB168(auVar2 * auVar18,8);
            auVar36._8_8_ = 0;
            auVar36._0_8_ = uVar44;
            s[0].d[0] = SUB168(auVar2 * auVar18,0);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = sec.d[0];
            auVar19._8_8_ = 0;
            auVar19._0_8_ = non.d[1];
            auVar3 = auVar3 * auVar19;
            uVar50 = SUB168(auVar3 + auVar36,0);
            uVar55 = SUB168(auVar3 + auVar36,8);
            auVar4._8_8_ = 0;
            auVar4._0_8_ = sec.d[1];
            auVar20._8_8_ = 0;
            auVar20._0_8_ = non.d[0];
            uVar45 = SUB168(auVar4 * auVar20,8);
            uVar43 = SUB168(auVar4 * auVar20,0);
            s[0].d[1] = uVar50 + uVar43;
            uVar43 = (ulong)CARRY8(uVar50,uVar43);
            uVar50 = uVar55 + uVar45;
            uVar56 = uVar50 + uVar43;
            uVar57 = (ulong)CARRY8(auVar3._8_8_,(ulong)CARRY8(uVar44,auVar3._0_8_)) +
                     (ulong)(CARRY8(uVar55,uVar45) || CARRY8(uVar50,uVar43));
            auVar5._8_8_ = 0;
            auVar5._0_8_ = sec.d[0];
            auVar21._8_8_ = 0;
            auVar21._0_8_ = non.d[2];
            uVar46 = SUB168(auVar5 * auVar21,8);
            uVar43 = SUB168(auVar5 * auVar21,0);
            uVar44 = uVar56 + uVar43;
            uVar43 = (ulong)CARRY8(uVar56,uVar43);
            uVar45 = uVar57 + uVar46;
            uVar58 = uVar45 + uVar43;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = sec.d[1];
            auVar22._8_8_ = 0;
            auVar22._0_8_ = non.d[1];
            uVar47 = SUB168(auVar6 * auVar22,8);
            uVar50 = SUB168(auVar6 * auVar22,0);
            uVar56 = uVar44 + uVar50;
            uVar50 = (ulong)CARRY8(uVar44,uVar50);
            uVar55 = uVar58 + uVar47;
            uVar59 = uVar55 + uVar50;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = sec.d[2];
            auVar23._8_8_ = 0;
            auVar23._0_8_ = non.d[0];
            uVar48 = SUB168(auVar7 * auVar23,8);
            uVar44 = SUB168(auVar7 * auVar23,0);
            s[0].d[2] = uVar56 + uVar44;
            uVar44 = (ulong)CARRY8(uVar56,uVar44);
            uVar56 = uVar59 + uVar48;
            uVar60 = uVar56 + uVar44;
            uVar51 = (ulong)(CARRY8(uVar57,uVar46) || CARRY8(uVar45,uVar43)) +
                     (ulong)(CARRY8(uVar58,uVar47) || CARRY8(uVar55,uVar50)) +
                     (ulong)(CARRY8(uVar59,uVar48) || CARRY8(uVar56,uVar44));
            auVar8._8_8_ = 0;
            auVar8._0_8_ = sec.d[0];
            auVar24._8_8_ = 0;
            auVar24._0_8_ = non.d[3];
            uVar48 = SUB168(auVar8 * auVar24,8);
            uVar43 = SUB168(auVar8 * auVar24,0);
            uVar44 = uVar60 + uVar43;
            uVar43 = (ulong)CARRY8(uVar60,uVar43);
            uVar55 = uVar51 + uVar48;
            uVar60 = uVar55 + uVar43;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = sec.d[1];
            auVar25._8_8_ = 0;
            auVar25._0_8_ = non.d[2];
            uVar57 = SUB168(auVar9 * auVar25,8);
            uVar50 = SUB168(auVar9 * auVar25,0);
            uVar45 = uVar44 + uVar50;
            uVar50 = (ulong)CARRY8(uVar44,uVar50);
            uVar56 = uVar60 + uVar57;
            uVar52 = uVar56 + uVar50;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = sec.d[2];
            auVar26._8_8_ = 0;
            auVar26._0_8_ = non.d[1];
            uVar58 = SUB168(auVar10 * auVar26,8);
            uVar44 = SUB168(auVar10 * auVar26,0);
            uVar47 = uVar45 + uVar44;
            uVar44 = (ulong)CARRY8(uVar45,uVar44);
            uVar46 = uVar52 + uVar58;
            uVar53 = uVar46 + uVar44;
            auVar11._8_8_ = 0;
            auVar11._0_8_ = sec.d[3];
            auVar27._8_8_ = 0;
            auVar27._0_8_ = non.d[0];
            uVar59 = SUB168(auVar11 * auVar27,8);
            uVar45 = SUB168(auVar11 * auVar27,0);
            s[0].d[3] = uVar47 + uVar45;
            uVar45 = (ulong)CARRY8(uVar47,uVar45);
            uVar47 = uVar53 + uVar59;
            uVar54 = uVar47 + uVar45;
            uVar57 = (ulong)(CARRY8(uVar51,uVar48) || CARRY8(uVar55,uVar43)) +
                     (ulong)(CARRY8(uVar60,uVar57) || CARRY8(uVar56,uVar50)) +
                     (ulong)(CARRY8(uVar52,uVar58) || CARRY8(uVar46,uVar44)) +
                     (ulong)(CARRY8(uVar53,uVar59) || CARRY8(uVar47,uVar45));
            auVar12._8_8_ = 0;
            auVar12._0_8_ = sec.d[1];
            auVar28._8_8_ = 0;
            auVar28._0_8_ = non.d[3];
            uVar46 = SUB168(auVar12 * auVar28,8);
            uVar43 = SUB168(auVar12 * auVar28,0);
            uVar44 = uVar54 + uVar43;
            uVar43 = (ulong)CARRY8(uVar54,uVar43);
            uVar45 = uVar57 + uVar46;
            uVar58 = uVar45 + uVar43;
            auVar13._8_8_ = 0;
            auVar13._0_8_ = sec.d[2];
            auVar29._8_8_ = 0;
            auVar29._0_8_ = non.d[2];
            uVar47 = SUB168(auVar13 * auVar29,8);
            uVar50 = SUB168(auVar13 * auVar29,0);
            uVar56 = uVar44 + uVar50;
            uVar50 = (ulong)CARRY8(uVar44,uVar50);
            uVar55 = uVar58 + uVar47;
            uVar59 = uVar55 + uVar50;
            auVar14._8_8_ = 0;
            auVar14._0_8_ = sec.d[3];
            auVar30._8_8_ = 0;
            auVar30._0_8_ = non.d[1];
            uVar48 = SUB168(auVar14 * auVar30,8);
            uVar44 = SUB168(auVar14 * auVar30,0);
            s[1].d[0] = uVar56 + uVar44;
            uVar44 = (ulong)CARRY8(uVar56,uVar44);
            uVar56 = uVar59 + uVar48;
            uVar51 = uVar56 + uVar44;
            uVar46 = (ulong)(CARRY8(uVar57,uVar46) || CARRY8(uVar45,uVar43)) +
                     (ulong)(CARRY8(uVar58,uVar47) || CARRY8(uVar55,uVar50)) +
                     (ulong)(CARRY8(uVar59,uVar48) || CARRY8(uVar56,uVar44));
            auVar15._8_8_ = 0;
            auVar15._0_8_ = sec.d[2];
            auVar31._8_8_ = 0;
            auVar31._0_8_ = non.d[3];
            uVar55 = SUB168(auVar15 * auVar31,8);
            uVar43 = SUB168(auVar15 * auVar31,0);
            uVar45 = uVar51 + uVar43;
            uVar43 = (ulong)CARRY8(uVar51,uVar43);
            uVar44 = uVar46 + uVar55;
            uVar47 = uVar44 + uVar43;
            auVar16._8_8_ = 0;
            auVar16._0_8_ = sec.d[3];
            auVar32._8_8_ = 0;
            auVar32._0_8_ = non.d[2];
            uVar56 = SUB168(auVar16 * auVar32,8);
            uVar50 = SUB168(auVar16 * auVar32,0);
            s[1].d[1] = uVar45 + uVar50;
            uVar50 = (ulong)CARRY8(uVar45,uVar50);
            uVar45 = uVar47 + uVar56;
            auVar34._8_8_ =
                 (ulong)(CARRY8(uVar46,uVar55) || CARRY8(uVar44,uVar43)) +
                 (ulong)(CARRY8(uVar47,uVar56) || CARRY8(uVar45,uVar50));
            auVar34._0_8_ = uVar45 + uVar50;
            auVar17._8_8_ = 0;
            auVar17._0_8_ = sec.d[3];
            auVar33._8_8_ = 0;
            auVar33._0_8_ = non.d[3];
            s[1].d._16_16_ = auVar17 * auVar33 + auVar34;
            local_a128 = ctx;
            secp256k1_scalar_reduce_512(&sec,s[0].d);
            secp256k1_scalar_set_b32((secp256k1_scalar *)seckey32,online_seckey,&overflow);
            if ((overflow == 0) &&
               (((seckey32._8_8_ != 0 || seckey32._0_8_ != 0) || seckey32._16_8_ != 0) ||
                seckey32._24_8_ != 0)) {
              secp256k1_scalar_add(&sec,&sec,(secp256k1_scalar *)seckey32);
              overflow_1 = 0;
              secp256k1_scalar_get_b32(seckey32,&sec);
              uVar43 = 0;
              ecmult_ctx = local_a128;
              do {
                iVar42 = (*pcVar49)((uchar *)&overflow,msg32,seckey32,(uchar *)0x0,noncedata,
                                    (uint)uVar43);
                bVar62 = true;
                if (iVar42 == 0) {
                  bVar1 = true;
                }
                else {
                  secp256k1_scalar_set_b32(&non,(uchar *)&overflow,&overflow_1);
                  local_a098 = 0;
                  uStack_a090 = 0;
                  _overflow = 0;
                  uStack_a0a0 = 0;
                  if ((overflow_1 == 0) &&
                     (((non.d[1] != 0 || non.d[0] != 0) || non.d[2] != 0) || non.d[3] != 0)) {
                    lVar61 = 1;
                    r = s;
                    local_a120 = uVar43;
                    b32 = sig->data;
                    do {
                      b32 = b32 + 0x20;
                      bVar62 = lVar61 - n_keys == 1;
                      bVar1 = !bVar62;
                      if (bVar62) {
LAB_0012b7b3:
                        bVar62 = true;
                        uVar43 = local_a120;
                        ecmult_ctx = local_a128;
                        goto LAB_0012b6ba;
                      }
                      msg32[0] = msg32[0] ^ (byte)lVar61;
                      bVar35 = (byte)((ulong)lVar61 >> 8);
                      msg32[1] = msg32[1] ^ bVar35;
                      iVar42 = (*pcVar49)(b32,msg32,seckey32,(uchar *)0x0,noncedata,(uint)local_a120
                                         );
                      if (iVar42 == 0) goto LAB_0012b7b3;
                      secp256k1_scalar_set_b32(r,b32,&overflow_1);
                      msg32[0] = msg32[0] ^ (byte)lVar61;
                      msg32[1] = msg32[1] ^ bVar35;
                      if (overflow_1 != 0) break;
                      puVar37 = r->d;
                      puVar38 = r->d;
                      puVar39 = r->d;
                      lVar61 = lVar61 + 1;
                      puVar40 = r->d;
                      r = r + 1;
                    } while (((puVar37[1] != 0 || *puVar38 != 0) || puVar39[2] != 0) ||
                             puVar40[3] != 0);
                    bVar1 = false;
                    bVar62 = false;
                    uVar43 = (ulong)((int)local_a120 + 1);
                    ecmult_ctx = local_a128;
                  }
                  else {
                    bVar1 = false;
                    bVar62 = false;
                    uVar43 = (ulong)((uint)uVar43 + 1);
                  }
                }
LAB_0012b6ba:
                if (bVar62) {
                  if (bVar1) {
                    return 0;
                  }
                  sig->n_keys = n_keys;
                  iVar42 = secp256k1_borromean_sign
                                     (&ecmult_ctx->ecmult_ctx,&ctx->ecmult_gen_ctx,sig->data,s,pubs,
                                      &non,&sec,&n_keys_local,&index,1,msg32,0x20);
                  secp256k1_scalar_get_b32(sig->data + sVar41 * 0x20 + 0x20,s + sVar41);
                  return iVar42;
                }
              } while( true );
            }
            secp256k1_scalar_add(&sec,&sec,(secp256k1_scalar *)seckey32);
          }
        }
        return 0;
      }
      secp256k1_whitelist_sign_cold_1();
    }
  }
  else {
    secp256k1_whitelist_sign_cold_5();
  }
  return 0;
}

Assistant:

int secp256k1_whitelist_sign(const secp256k1_context* ctx, secp256k1_whitelist_signature *sig, const secp256k1_pubkey *online_pubkeys, const secp256k1_pubkey *offline_pubkeys, const size_t n_keys, const secp256k1_pubkey *sub_pubkey, const unsigned char *online_seckey, const unsigned char *summed_seckey, const size_t index, secp256k1_nonce_function noncefp, const void *noncedata) {
    secp256k1_gej pubs[MAX_KEYS];
    secp256k1_scalar s[MAX_KEYS];
    secp256k1_scalar sec, non;
    unsigned char msg32[32];
    int ret;

    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }

    /* Sanity checks */
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(sig != NULL);
    ARG_CHECK(online_pubkeys != NULL);
    ARG_CHECK(offline_pubkeys != NULL);
    ARG_CHECK(n_keys <= MAX_KEYS);
    ARG_CHECK(sub_pubkey != NULL);
    ARG_CHECK(online_seckey != NULL);
    ARG_CHECK(summed_seckey != NULL);
    ARG_CHECK(index < n_keys);

    /* Compute pubkeys: online_pubkey + tweaked(offline_pubkey + address), and message */
    ret = secp256k1_whitelist_compute_keys_and_message(ctx, msg32, pubs, online_pubkeys, offline_pubkeys, n_keys, sub_pubkey);

    /* Compute signing key: online_seckey + tweaked(summed_seckey) */
    if (ret) {
        ret = secp256k1_whitelist_compute_tweaked_privkey(ctx, &sec, online_seckey, summed_seckey);
    }
    /* Compute nonce and random s-values */
    if (ret) {
        unsigned char seckey32[32];
        unsigned int count = 0;
        int overflow = 0;

        secp256k1_scalar_get_b32(seckey32, &sec);
        while (1) {
            size_t i;
            unsigned char nonce32[32];
            int done;
            ret = noncefp(nonce32, msg32, seckey32, NULL, (void*)noncedata, count);
            if (!ret) {
                break;
            }
            secp256k1_scalar_set_b32(&non, nonce32, &overflow);
            memset(nonce32, 0, 32);
            if (overflow || secp256k1_scalar_is_zero(&non)) {
                count++;
                continue;
            }
            done = 1;
            for (i = 0; i < n_keys; i++) {
                msg32[0] ^= i + 1;
                msg32[1] ^= (i + 1) / 0x100;
                ret = noncefp(&sig->data[32 * (i + 1)], msg32, seckey32, NULL, (void*)noncedata, count);
                if (!ret) {
                    break;
                }
                secp256k1_scalar_set_b32(&s[i], &sig->data[32 * (i + 1)], &overflow);
                msg32[0] ^= i + 1;
                msg32[1] ^= (i + 1) / 0x100;
                if (overflow || secp256k1_scalar_is_zero(&s[i])) {
                    count++;
                    done = 0;
                    break;
                }
            }
            if (done) {
                break;
            }
        }
        memset(seckey32, 0, 32);
    }
    /* Actually sign */
    if (ret) {
        sig->n_keys = n_keys;
        ret = secp256k1_borromean_sign(&ctx->ecmult_ctx, &ctx->ecmult_gen_ctx, &sig->data[0], s, pubs, &non, &sec, &n_keys, &index, 1, msg32, 32);
        /* Signing will change s[index], so update in the sig structure */
        secp256k1_scalar_get_b32(&sig->data[32 * (index + 1)], &s[index]);
    }

    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    return ret;
}